

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O3

void screen_init(void)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  Display *pDVar6;
  int iVar7;
  long lVar8;
  XRRScreenSize *pXVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  float fVar16;
  int nscreens;
  float local_24;
  float local_20;
  int local_1c;
  
  if (fl_display == (Display *)0x0) {
    fl_open_display();
  }
  if (screen_init::XRRSizes_f == (XRRSizes_type)0x0) {
    lVar8 = dlopen("libXrandr.so.2",1);
    if ((lVar8 != 0) || (lVar8 = dlopen("libXrandr.so"), lVar8 != 0)) {
      screen_init::XRRSizes_f = (XRRSizes_type)dlsym(lVar8);
    }
    if (screen_init::XRRSizes_f != (XRRSizes_type)0x0) goto LAB_001a2dd3;
    bVar4 = true;
    local_20 = 0.0;
    local_24 = 0.0;
  }
  else {
LAB_001a2dd3:
    pXVar9 = (*screen_init::XRRSizes_f)(fl_display,fl_screen,&local_1c);
    bVar4 = local_1c < 1;
    if (local_1c < 1) {
      local_20 = 0.0;
      local_24 = 0.0;
    }
    else {
      local_20 = 0.0;
      local_24 = 0.0;
      if (pXVar9->mwidth != 0) {
        local_24 = ((float)pXVar9->width * 25.4) / (float)pXVar9->mwidth;
      }
      if (pXVar9->mheight != 0) {
        local_20 = ((float)pXVar9->height * 25.4) / (float)pXVar9->mheight;
      }
    }
  }
  iVar7 = XineramaIsActive(fl_display);
  if (iVar7 == 0) {
    uVar1 = *(uint *)(fl_display + 0xe4);
    num_screens = 0x10;
    if ((int)uVar1 < 0x10) {
      num_screens = uVar1;
    }
    if ((int)uVar1 < 1) {
      return;
    }
    lVar8 = *(long *)(fl_display + 0xe8);
    lVar11 = (long)fl_screen;
    uVar13 = (ulong)(uint)num_screens;
    piVar10 = (int *)(lVar8 + 0x20);
    uVar12 = 0;
    do {
      screens[uVar12].x_org = 0;
      screens[uVar12].y_org = 0;
      iVar7 = piVar10[-2];
      screens[uVar12].width = (short)iVar7;
      iVar5 = piVar10[-1];
      screens[uVar12].height = (short)iVar5;
      if (bVar4) {
        fVar16 = 0.0;
        if (*piVar10 != 0) {
          fVar16 = ((float)(int)(short)iVar7 * 25.4) / (float)*piVar10;
        }
        dpi[uVar12][0] = fVar16;
        iVar7 = *(int *)(lVar11 * 0x80 + lVar8 + 0x24);
        fVar16 = 0.0;
        if (iVar7 != 0) {
          fVar16 = ((float)(int)(short)iVar5 * 25.4) / (float)iVar7;
        }
      }
      else {
        dpi[uVar12][0] = local_24;
        fVar16 = local_20;
      }
      dpi[uVar12][1] = fVar16;
      uVar12 = uVar12 + 1;
      piVar10 = piVar10 + 0x20;
    } while (uVar13 != uVar12);
    return;
  }
  lVar8 = XineramaQueryScreens(fl_display,&num_screens);
  pDVar6 = fl_display;
  if (num_screens < 0x11) {
    if (num_screens < 1) {
      if (lVar8 == 0) {
        return;
      }
      goto LAB_001a3073;
    }
  }
  else {
    num_screens = 0x10;
  }
  lVar11 = (long)fl_screen;
  uVar13 = (ulong)(uint)num_screens;
  puVar14 = (undefined8 *)(lVar8 + 4);
  lVar15 = 0;
  do {
    uVar2 = *puVar14;
    *(undefined8 *)((long)&screens[0].x_org + lVar15) = uVar2;
    if (bVar4) {
      lVar3 = *(long *)(pDVar6 + 0xe8);
      iVar7 = *(int *)(lVar3 + 0x20 + lVar11 * 0x80);
      fVar16 = 0.0;
      if (iVar7 != 0) {
        fVar16 = ((float)(int)(short)((ulong)uVar2 >> 0x20) * 25.4) / (float)iVar7;
      }
      *(float *)((long)dpi[0] + lVar15) = fVar16;
      iVar7 = *(int *)(lVar3 + 0x24 + lVar11 * 0x80);
      fVar16 = 0.0;
      if (iVar7 != 0) {
        fVar16 = ((float)(int)(short)((ulong)uVar2 >> 0x30) * 25.4) / (float)iVar7;
      }
    }
    else {
      *(float *)((long)dpi[0] + lVar15) = local_24;
      fVar16 = local_20;
    }
    *(float *)((long)dpi[0] + lVar15 + 4) = fVar16;
    puVar14 = (undefined8 *)((long)puVar14 + 0xc);
    lVar15 = lVar15 + 8;
    uVar13 = uVar13 - 1;
  } while (uVar13 != 0);
LAB_001a3073:
  XFree(lVar8);
  return;
}

Assistant:

static void screen_init() {
  if (!fl_display) fl_open_display();

  int dpi_by_randr = 0;
  float dpih = 0.0f, dpiv = 0.0f;

#if USE_XRANDR

  static XRRSizes_type XRRSizes_f = NULL;
  if (!XRRSizes_f) {
    void *libxrandr_addr = dlopen("libXrandr.so.2", RTLD_LAZY);
    if (!libxrandr_addr) libxrandr_addr = dlopen("libXrandr.so", RTLD_LAZY);
#   ifdef __APPLE_CC__ // allows testing on Darwin + X11
    if (!libxrandr_addr) libxrandr_addr = dlopen("/opt/X11/lib/libXrandr.dylib", RTLD_LAZY);
#   endif
    if (libxrandr_addr) XRRSizes_f = (XRRSizes_type)dlsym(libxrandr_addr, "XRRSizes");
  }
  if (XRRSizes_f) {
    int nscreens;
    XRRScreenSize *ssize = XRRSizes_f(fl_display, fl_screen, &nscreens);

    //for (int i=0; i<nscreens; i++)
    //  printf("width=%d height=%d mwidth=%d mheight=%d\n",
    //         ssize[i].width,ssize[i].height,ssize[i].mwidth,ssize[i].mheight);

    if (nscreens > 0) { // Note: XRRSizes() *may* return nscreens == 0, see docs
      int mm = ssize[0].mwidth;
      dpih = mm ? ssize[0].width*25.4f/mm : 0.0f;
      mm = ssize[0].mheight;
      dpiv = mm ? ssize[0].height*25.4f/mm : 0.0f;
      dpi_by_randr = 1;
    }
  }

#endif // USE_XRANDR

#if HAVE_XINERAMA

  if (XineramaIsActive(fl_display)) {
    XineramaScreenInfo *xsi = XineramaQueryScreens(fl_display, &num_screens);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    /* There's no way to use different DPI for different Xinerama screens. */
    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = xsi[i].x_org;
      screens[i].y_org = xsi[i].y_org;
      screens[i].width = xsi[i].width;
      screens[i].height = xsi[i].height;

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
        int mm = DisplayWidthMM(fl_display, fl_screen);
        dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
        mm = DisplayHeightMM(fl_display, fl_screen);
        dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
    if (xsi) XFree(xsi);
  } else

#endif // HAVE_XINERAMA

  { // ! HAVE_XINERAMA || ! XineramaIsActive()
    num_screens = ScreenCount(fl_display);
    if (num_screens > MAX_SCREENS) num_screens = MAX_SCREENS;

    for (int i=0; i<num_screens; i++) {
      screens[i].x_org = 0;
      screens[i].y_org = 0;
      screens[i].width = DisplayWidth(fl_display, i);
      screens[i].height = DisplayHeight(fl_display, i);

      if (dpi_by_randr) {
	dpi[i][0] = dpih;
	dpi[i][1] = dpiv;
      } else {
	int mm = DisplayWidthMM(fl_display, i);
	dpi[i][0] = mm ? screens[i].width*25.4f/mm : 0.0f;
	mm = DisplayHeightMM(fl_display, fl_screen);
	dpi[i][1] = mm ? screens[i].height*25.4f/mm : 0.0f;
      }
    }
  }
}